

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_file_cache.cpp
# Opt level: O1

void __thiscall
duckdb::ExternalFileCache::ExternalFileCache
          (ExternalFileCache *this,DatabaseInstance *db,bool enable_p)

{
  BufferManager *pBVar1;
  
  pBVar1 = BufferManager::GetBufferManager(db);
  this->buffer_manager = pBVar1;
  (this->enable)._M_base._M_i = enable_p;
  (this->cached_files)._M_h._M_buckets = &(this->cached_files)._M_h._M_single_bucket;
  (this->cached_files)._M_h._M_bucket_count = 1;
  (this->cached_files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cached_files)._M_h._M_element_count = 0;
  (this->cached_files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cached_files)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cached_files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

ExternalFileCache::ExternalFileCache(DatabaseInstance &db, bool enable_p)
    : buffer_manager(BufferManager::GetBufferManager(db)), enable(enable_p) {
}